

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelloWorld.cpp
# Opt level: O2

int main(void)

{
  Session *this;
  atomic<unsigned_long> eventSourceId;
  cx_string<2UL> cVar1;
  SessionWriter *pSVar2;
  __atomic_base<unsigned_long> _Var3;
  nanoseconds clock;
  basic_ofstream<char,_std::char_traits<char>_> *out;
  bool bVar4;
  allocator local_304;
  allocator local_303;
  allocator local_302;
  allocator local_301;
  ConsumeResult local_300;
  undefined1 local_2e0 [48];
  string local_2b0 [32];
  string local_290 [32];
  uint64_t local_270;
  string local_268 [32];
  string local_248 [32];
  ofstream logfile;
  char cStack_226;
  undefined5 uStack_225;
  byte abStack_208 [480];
  
  pSVar2 = binlog::default_thread_local_writer();
  if ((pSVar2->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      this = pSVar2->_session;
      local_2e0._0_8_ = 0;
      local_2e0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_2e0 + 0x10),"main",(allocator *)&local_300);
      std::__cxx11::string::string(local_2b0,"main",&local_301);
      std::__cxx11::string::string
                (local_290,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/example/HelloWorld.cpp"
                 ,&local_302);
      local_270 = 0xc;
      std::__cxx11::string::string(local_268,"Hello {}!",&local_303);
      cVar1 = binlog::detail::concatenated_tags<char_const(&)[10],char_const(&)[6]>
                        ((char (*) [10])"Hello {}!",(char (*) [6])"World");
      _logfile = cVar1._data._0_2_;
      cStack_226 = cVar1._data[2];
      std::__cxx11::string::string(local_248,(char *)&logfile,&local_304);
      _Var3._M_i = binlog::Session::addEventSource(this,(EventSource *)local_2e0);
      binlog::EventSource::~EventSource((EventSource *)local_2e0);
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
    }
    eventSourceId.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar2 = binlog::default_thread_local_writer();
    clock = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<char_const(&)[6]>
              (pSVar2,(uint64_t)eventSourceId.super___atomic_base<unsigned_long>._M_i,clock.__r,
               (char (*) [6])"World");
  }
  std::ofstream::ofstream((binlog *)&logfile,"hello.blog",_S_out|_S_bin);
  binlog::consume<std::ofstream>(&local_300,(binlog *)&logfile,out);
  bVar4 = (abStack_208[*(long *)(CONCAT53(uStack_225,CONCAT12(cStack_226,_logfile)) + -0x18)] & 5)
          == 0;
  if (bVar4) {
    std::operator<<((ostream *)&std::cout,"Binary log written to hello.blog\n");
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Failed to write hello.blog\n");
  }
  std::ofstream::~ofstream(&logfile);
  return (uint)!bVar4;
}

Assistant:

int main()
{
  BINLOG_INFO("Hello {}!", "World");

  std::ofstream logfile("hello.blog", std::ofstream::out|std::ofstream::binary);
  binlog::consume(logfile);
//]

  if (! logfile)
  {
    std::cerr << "Failed to write hello.blog\n";
    return 1;
  }

  std::cout << "Binary log written to hello.blog\n";
  return 0;

//[hello
}